

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

LocalTime * Time::LocalTime::Now(void)

{
  LocalTime *in_RDI;
  Time local_28;
  
  Time::Now();
  toLocal(in_RDI,&local_28);
  Time::~Time(&local_28);
  return in_RDI;
}

Assistant:

LocalTime LocalTime::Now()
    {
        return toLocal(Time::Now());
    }